

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O1

Result __thiscall
presolve::HPresolve::removeRowSingletons(HPresolve *this,HighsPostsolveStack *postsolve_stack)

{
  int row;
  Result RVar1;
  pointer piVar2;
  Result unaff_EBP;
  long lVar3;
  bool bVar4;
  bool bVar5;
  
  piVar2 = (this->singletonRows).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  bVar4 = (this->singletonRows).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish == piVar2;
  if (!bVar4) {
    lVar3 = 0;
    do {
      row = piVar2[lVar3];
      bVar5 = false;
      if (((this->rowDeleted).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start[row] == '\0') &&
         ((this->rowsize).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start[row] < 2)) {
        RVar1 = rowPresolve(this,postsolve_stack,row);
        bVar5 = RVar1 != kOk;
        if (bVar5) {
          unaff_EBP = RVar1;
        }
      }
      if (bVar5) break;
      lVar3 = lVar3 + 1;
      piVar2 = (this->singletonRows).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      bVar4 = lVar3 == (long)(this->singletonRows).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_finish - (long)piVar2 >> 2;
    } while (!bVar4);
  }
  if (bVar4) {
    piVar2 = (this->singletonRows).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    unaff_EBP = kOk;
    if ((this->singletonRows).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish != piVar2) {
      (this->singletonRows).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = piVar2;
    }
  }
  return unaff_EBP;
}

Assistant:

HPresolve::Result HPresolve::removeRowSingletons(
    HighsPostsolveStack& postsolve_stack) {
  for (size_t i = 0; i != singletonRows.size(); ++i) {
    HighsInt row = singletonRows[i];
    if (rowDeleted[row] || rowsize[row] > 1) continue;
    // row presolve will delegate to rowSingleton() if the row size is 1
    // if the singleton row has become empty it will also remove the row
    HPRESOLVE_CHECKED_CALL(rowPresolve(postsolve_stack, row));
  }

  singletonRows.clear();

  return Result::kOk;
}